

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmFDbcc<(moira::Instr)190,(moira::Mode)12,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  int iVar2;
  Syntax SVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  char cVar7;
  char *pcVar8;
  uint uVar9;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar4 = (*this->_vptr_Moira[6])();
  if ((0x1f < (ushort)uVar4) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)190,(moira::Mode)12,2>(this,str,addr,op);
    return;
  }
  uVar9 = *addr + 2;
  *addr = uVar9;
  iVar5 = (*this->_vptr_Moira[6])(this,(ulong)uVar9);
  cVar7 = 'f';
  lVar6 = 1;
  do {
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
    *pcVar8 = cVar7;
    cVar7 = "fdb"[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  StrWriter::operator<<(str,(Fcc)(uVar4 & 0x1f));
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
    *pcVar8 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    pcVar8 = str->ptr;
    do {
      str->ptr = pcVar8 + 1;
      *pcVar8 = ' ';
      pcVar8 = str->ptr;
    } while (pcVar8 < str->base + iVar2);
  }
  StrWriter::operator<<(str,(Dn)(op & 7));
  pcVar8 = str->ptr;
  str->ptr = pcVar8 + 1;
  *pcVar8 = ',';
  SVar3 = str->style->syntax;
  if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
    *pcVar8 = ' ';
  }
  StrWriter::operator<<(str,(UInt)(uVar9 + (int)(short)iVar5));
  return;
}

Assistant:

void
Moira::dasmFDbcc(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead(addr);
    auto src = _____________xxx (op);
    auto cnd = ___________xxxxx (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtFPU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    auto dst = addr + 2;
    U32_INC(dst, SEXT<S>(dasmIncRead<S>(addr)));

    str << Ins<I>{} << Fcc{cnd} << str.tab << Dn{src} << Sep{} << UInt(dst);
}